

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_compress_open(char *filename,int rwmode,int *hdl)

{
  memdriver *pmVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  size_t msize;
  FILE *diskfile;
  uchar buffer [4];
  FILE *local_40;
  undefined4 local_34;
  
  if (rwmode != 0) {
    ffpmsg("cannot open compressed file with WRITE access (mem_compress_open)");
    ffpmsg(filename);
    return 0x70;
  }
  iVar6 = file_openfile(filename,0,(FILE **)&local_40);
  if (iVar6 != 0) {
    ffpmsg("failed to open compressed disk file (compress_open)");
    goto LAB_00117d5c;
  }
  sVar7 = fread(&local_34,1,2,local_40);
  if (sVar7 != 2) {
    fclose(local_40);
    return 0x6c;
  }
  if ((ushort)local_34 == -0x74e1) {
    fseek(local_40,0,2);
    uVar8 = ftell(local_40);
    fseek(local_40,-4,1);
    fread(&local_34,1,4,local_40);
    uVar12 = (ulong)(ushort)local_34;
    bVar4 = local_34._2_1_;
    uVar9 = (ulong)local_34._3_1_ << 0x18;
    if (uVar8 < 0x2711) {
      uVar8 = (ulong)(uint3)local_34;
    }
    else {
      uVar9 = uVar9 | (ulong)bVar4 << 0x10 | uVar12;
      if ((long)uVar8 <= (long)uVar9) {
        uVar8 = uVar9;
      }
      uVar8 = (uVar8 - uVar9) + 0xffffffff & 0xffffffff00000000;
    }
    msize = uVar8 | uVar9;
LAB_00117e91:
    bVar3 = false;
    bVar5 = false;
    if (msize == 0) goto LAB_00117e99;
  }
  else {
    if ((ushort)local_34 == 0x4b50) {
      fseek(local_40,0x16,0);
      fread(&local_34,1,4,local_40);
      msize = (size_t)local_34;
      goto LAB_00117e91;
    }
    bVar5 = true;
    if ((((local_34 & 0xffff) != 0x1e1f) && ((local_34 & 0xffff) != 0x9d1f)) &&
       ((ushort)local_34 != -0x5fe1)) {
      fclose(local_40);
      return 1;
    }
LAB_00117e99:
    bVar3 = bVar5;
    fseek(local_40,0,2);
    lVar10 = ftell(local_40);
    msize = lVar10 * 3;
  }
  fseek(local_40,0,0);
  iVar6 = mem_createmem(msize,hdl);
  if ((bVar3) && (iVar6 != 0)) {
    iVar6 = mem_createmem(msize / 3,hdl);
  }
  if (iVar6 == 0) {
    iVar6 = mem_uncompress2mem(filename,(FILE *)local_40,*hdl);
    fclose(local_40);
    iVar2 = *hdl;
    pmVar1 = memTable + iVar2;
    if (iVar6 == 0) {
      if (*memTable[iVar2].memsizeptr <= memTable[iVar2].fitsfilesize + 0x100U) {
        return 0;
      }
      pcVar11 = (char *)realloc(*pmVar1->memaddrptr,memTable[iVar2].fitsfilesize);
      if (pcVar11 != (char *)0x0) {
        iVar6 = *hdl;
        *memTable[iVar6].memaddrptr = pcVar11;
        *memTable[iVar6].memsizeptr = memTable[iVar6].fitsfilesize;
        return 0;
      }
      ffpmsg("Failed to reduce size of allocated memory (compress_open)");
      return 0x71;
    }
    free(*pmVar1->memaddrptr);
    pmVar1->memaddrptr = (char **)0x0;
    memTable[iVar2].memaddr = (char *)0x0;
    filename = "failed to uncompress file into memory (compress_open)";
  }
  else {
    fclose(local_40);
    filename = "failed to create empty memory file (compress_open)";
  }
LAB_00117d5c:
  ffpmsg(filename);
  return iVar6;
}

Assistant:

int mem_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile and creates an empty memory
  buffer with an appropriate size, then calls mem_uncompress2mem.
*/
{
    FILE *diskfile;
    int status, estimated = 1;
    unsigned char buffer[4];
    size_t finalsize, filesize;
    LONGLONG llsize = 0;
    unsigned int modulosize;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed file with WRITE access (mem_compress_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (compress_open)");
        ffpmsg(filename);
        return(status);
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);
        return(READ_ERROR);
    }

    if (memcmp(buffer, "\037\213", 2) == 0)  /* GZIP */
    {
        /* the uncompressed file size is give at the end */
        /* of the file in the ISIZE field  (modulo 2^32) */

        fseek(diskfile, 0, 2);            /* move to end of file */
        filesize = ftell(diskfile);       /* position = size of file */
        fseek(diskfile, -4L, 1);          /* move back 4 bytes */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;

/*
  the field ISIZE in the gzipped file header only stores 4 bytes and contains
  the uncompressed file size modulo 2^32.  If the uncompressed file size
  is less than the compressed file size (filesize), then one probably needs to
  add 2^32 = 4294967296 to the uncompressed file size, assuming that the gzip
  produces a compressed file that is smaller than the original file.

  But one must allow for the case of very small files, where the
  gzipped file may actually be larger then the original uncompressed file.
  Therefore, only perform the modulo 2^32 correction test if the compressed 
  file is greater than 10,000 bytes in size.  (Note: this threhold would
  fail only if the original file was greater than 2^32 bytes in size AND gzip 
  was able to compress it by more than a factor of 400,000 (!) which seems
  highly unlikely.)
  
  Also, obviously, this 2^32 modulo correction cannot be performed if the
  finalsize variable is only 32-bits long.  Typically, the 'size_t' integer
  type must be 8 bytes or larger in size to support data files that are 
  greater than 2 GB (2^31 bytes) in size.  
*/
        finalsize = modulosize;

        if (sizeof(size_t) > 4 && filesize > 10000) {
	    llsize = (LONGLONG) finalsize;  
	    /* use LONGLONG variable to suppress compiler warning */
            while (llsize <  (LONGLONG) filesize) llsize += 4294967296;

            finalsize = (size_t) llsize;
        }

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\120\113", 2) == 0)   /* PKZIP */
    {
        /* the uncompressed file size is give at byte 22 the file */

        fseek(diskfile, 22L, 0);            /* move to byte 22 */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;
        finalsize = modulosize;

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\037\036", 2) == 0)  /* PACK */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\235", 2) == 0)  /* LZW */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\240", 2) == 0)  /* LZH */
        finalsize = 0;  /* for most methods we can't determine final size */
#if HAVE_BZIP2
    else if (memcmp(buffer, "BZ", 2) == 0)        /* BZip2 */
        finalsize = 0;  /* for most methods we can't determine final size */
#endif
    else
    {
        /* not a compressed file; this should never happen */
        fclose(diskfile);
        return(1);
    }